

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBatchInsert::GetGlobalSinkState(PhysicalBatchInsert *this,ClientContext *context)

{
  Catalog *this_00;
  SchemaCatalogEntry *schema;
  pointer puVar1;
  pointer puVar2;
  CatalogTransaction transaction;
  optional_ptr<duckdb::TableCatalogEntry,_true> table_00;
  type info;
  ColumnList *pCVar3;
  BatchInsertGlobalState *this_01;
  ClientContext *in_RDX;
  optional_ptr<duckdb::TableCatalogEntry,_true> table;
  optional_ptr<duckdb::CatalogEntry,_true> created_table;
  optional_ptr<duckdb::TableCatalogEntry,_true> local_68;
  optional_ptr<duckdb::CatalogEntry,_true> local_60;
  CatalogTransaction local_58;
  
  local_68.ptr = (TableCatalogEntry *)0x0;
  if ((context->config).system_progress_bar_disable_reason == (char *)0x0) {
    local_68.ptr = (TableCatalogEntry *)(context->config).profiler_settings._M_h._M_buckets;
  }
  else {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid
              ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
               &(context->config).emit_profiler_output);
    this_00 = *(Catalog **)(*(long *)&(context->config).emit_profiler_output + 0xd8);
    Catalog::GetCatalogTransaction(&local_58,this_00,in_RDX);
    schema = *(SchemaCatalogEntry **)&(context->config).emit_profiler_output;
    info = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)&(context->config).system_progress_bar_disable_reason);
    transaction.context.ptr = local_58.context.ptr;
    transaction.db.ptr = local_58.db.ptr;
    transaction.transaction.ptr = local_58.transaction.ptr;
    transaction.transaction_id = local_58.transaction_id;
    transaction.start_time = local_58.start_time;
    local_60 = Catalog::CreateTable(this_00,transaction,schema,info);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_60);
    local_68.ptr = (TableCatalogEntry *)local_60.ptr;
  }
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_68);
  pCVar3 = TableCatalogEntry::GetColumns(local_68.ptr);
  puVar1 = (pCVar3->physical_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (pCVar3->physical_columns).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  optional_ptr<duckdb::TableCatalogEntry,_true>::CheckValid(&local_68);
  table_00.ptr = local_68.ptr;
  this_01 = (BatchInsertGlobalState *)operator_new(0x1b8);
  BatchInsertGlobalState::BatchInsertGlobalState
            (this_01,in_RDX,(DuckTableEntry *)table_00.ptr,((long)puVar1 - (long)puVar2) * 0x80000);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)this_01;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBatchInsert::GetGlobalSinkState(ClientContext &context) const {
	optional_ptr<TableCatalogEntry> table;
	if (info) {
		// CREATE TABLE AS
		D_ASSERT(!insert_table);
		auto &catalog = schema->catalog;
		auto created_table = catalog.CreateTable(catalog.GetCatalogTransaction(context), *schema.get_mutable(), *info);
		table = &created_table->Cast<TableCatalogEntry>();
	} else {
		D_ASSERT(insert_table);
		D_ASSERT(insert_table->IsDuckTable());
		table = insert_table.get_mutable();
	}
	// heuristic - we start off by allocating 4MB of cache space per column
	static constexpr const idx_t MINIMUM_MEMORY_PER_COLUMN = 4ULL * 1024ULL * 1024ULL;
	auto minimum_memory_per_thread = table->GetColumns().PhysicalColumnCount() * MINIMUM_MEMORY_PER_COLUMN;
	auto result = make_uniq<BatchInsertGlobalState>(context, table->Cast<DuckTableEntry>(), minimum_memory_per_thread);
	return std::move(result);
}